

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::IncompleteTextureAccess::SamplerTest::iterate(SamplerTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  ContextType ctxType;
  MessageBuilder *this_01;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  long lVar2;
  undefined1 *puVar3;
  bool bVar4;
  undefined1 local_1b0 [384];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (bVar1) {
    PrepareFramebuffer(this);
    PrepareVertexArrays(this);
    bVar1 = true;
    lVar2 = 0xf;
    puVar3 = s_configurations;
    this_00 = (ostringstream *)(local_1b0 + 8);
    while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
      PrepareProgram(this,*(Configuration *)puVar3);
      PrepareTexture(this,*(Configuration *)puVar3);
      Draw(this);
      bVar4 = Check(this,*(Configuration *)puVar3);
      if (!bVar4) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "Incomplete texture sampler access test failed with sampler ");
        this_01 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             &((Configuration *)puVar3)->sampler_template);
        std::operator<<(&(this_01->m_str).super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        bVar1 = false;
      }
      CleanCase(this);
      puVar3 = (undefined1 *)((long)puVar3 + 0x28);
    }
    CleanCase(this);
    CleanTest(this);
    this_02 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar1) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_02 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SamplerTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));

	if (!is_at_least_gl_45)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareFramebuffer();
		PrepareVertexArrays();

		for (glw::GLuint i = 0; i < s_configurations_count; ++i)
		{
			PrepareProgram(s_configurations[i]);
			PrepareTexture(s_configurations[i]);

			Draw();

			if (!Check(s_configurations[i]))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Incomplete texture sampler access test failed with sampler "
					<< s_configurations[i].sampler_template << "." << tcu::TestLog::EndMessage;

				is_ok = false;
			}

			CleanCase();
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanCase();
	CleanTest();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}